

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

floatx80 roundAndPackFloatx80_aarch64
                   (int8_t roundingPrecision,flag zSign,int32_t zExp,uint64_t zSig0,uint64_t zSig1,
                   float_status *status)

{
  char cVar1;
  ulong uVar2;
  bool bVar3;
  bool bVar4;
  floatx80 fVar5;
  bool local_92;
  bool local_91;
  bool local_82;
  bool local_81;
  int64_t local_70;
  int64_t local_68;
  int64_t roundBits;
  int64_t roundMask;
  int64_t roundIncrement;
  flag isTiny;
  flag increment;
  flag roundNearestEven;
  int8_t roundingMode;
  float_status *status_local;
  uint64_t zSig1_local;
  uint64_t zSig0_local;
  int32_t zExp_local;
  flag zSign_local;
  int8_t roundingPrecision_local;
  uint16_t local_10;
  
  cVar1 = status->float_rounding_mode;
  bVar4 = cVar1 == '\0';
  status_local = (float_status *)zSig1;
  zSig0_local._0_4_ = zExp;
  zSig0_local._6_1_ = zSign;
  zSig0_local._7_1_ = roundingPrecision;
  if (roundingPrecision == 'P') {
code_r0x006a95bf:
    zSig1_local = zSig0;
    switch(cVar1) {
    case '\0':
    case '\x04':
      local_81 = (long)zSig1 < 0;
      break;
    case '\x01':
      local_82 = zSign != '\0' && zSig1 != 0;
      local_81 = local_82;
      break;
    case '\x02':
      local_81 = zSign == '\0' && zSig1 != 0;
      break;
    case '\x03':
      local_81 = false;
      break;
    default:
      abort();
    }
    if (0x7ffc < zExp - 1U) {
      if ((0x7ffe < zExp) || (((zExp == 0x7ffe && (zSig0 == 0xffffffffffffffff)) && (local_81)))) {
        roundBits = 0;
LAB_006a9683:
        float_raise_aarch64('(',status);
        if (((cVar1 == '\x03') || ((zSig0_local._6_1_ != '\0' && (cVar1 == '\x02')))) ||
           ((zSig0_local._6_1_ == '\0' && (cVar1 == '\x01')))) {
          fVar5 = packFloatx80(zSig0_local._6_1_,0x7ffe,roundBits ^ 0xffffffffffffffff);
          local_10 = fVar5.high;
        }
        else {
          fVar5 = packFloatx80(zSig0_local._6_1_,0x7fff,0x8000000000000000);
          local_10 = fVar5.high;
        }
        goto LAB_006a994a;
      }
      if (zExp < 1) {
        bVar3 = true;
        if (((status->float_detect_tininess != '\x01') && (bVar3 = true, -1 < zExp)) &&
           (bVar3 = true, local_81)) {
          bVar3 = zSig0 != 0xffffffffffffffff;
        }
        shift64ExtraRightJamming(zSig0,zSig1,1 - zExp,&zSig1_local,(uint64_t *)&status_local);
        zSig0_local._0_4_ = 0;
        if ((bVar3) && (status_local != (float_status *)0x0)) {
          float_raise_aarch64('\x10',status);
        }
        if (status_local != (float_status *)0x0) {
          status->float_exception_flags = status->float_exception_flags | 0x20;
        }
        switch(cVar1) {
        case '\0':
        case '\x04':
          local_91 = (long)status_local < 0;
          break;
        case '\x01':
          local_92 = zSig0_local._6_1_ != '\0' && status_local != (float_status *)0x0;
          local_91 = local_92;
          break;
        case '\x02':
          local_91 = zSig0_local._6_1_ == '\0' && status_local != (float_status *)0x0;
          break;
        case '\x03':
          local_91 = false;
          break;
        default:
          abort();
        }
        if ((local_91) &&
           (zSig1_local = (long)(int)((((ulong)status_local & 0x7fffffffffffffff) == 0 && bVar4) ^
                                     0xffffffff) & zSig1_local + 1, (long)zSig1_local < 0)) {
          zSig0_local._0_4_ = 1;
        }
        fVar5 = packFloatx80(zSig0_local._6_1_,(int32_t)zSig0_local,zSig1_local);
        local_10 = fVar5.high;
        goto LAB_006a994a;
      }
    }
    if (zSig1 != 0) {
      status->float_exception_flags = status->float_exception_flags | 0x20;
    }
    if (local_81) {
      if (zSig0 + 1 == 0) {
        zSig0_local._0_4_ = zExp + 1;
        zSig1_local = 0x8000000000000000;
      }
      else {
        zSig1_local = (long)(int)(((zSig1 & 0x7fffffffffffffff) == 0 && bVar4) ^ 0xffffffff) &
                      zSig0 + 1;
      }
    }
    else if (zSig0 == 0) {
      zSig0_local._0_4_ = 0;
    }
    fVar5 = packFloatx80(zSign,(int32_t)zSig0_local,zSig1_local);
    local_10 = fVar5.high;
  }
  else {
    if (roundingPrecision == '@') {
      roundMask = 0x400;
      roundBits = 0x7ff;
    }
    else {
      if (roundingPrecision != ' ') goto code_r0x006a95bf;
      roundMask = 0x8000000000;
      roundBits = 0xffffffffff;
    }
    zSig1_local = zSig0 | zSig1 != 0;
    switch(cVar1) {
    case '\0':
    case '\x04':
      break;
    case '\x01':
      if (zSign == '\0') {
        local_70 = 0;
      }
      else {
        local_70 = roundBits;
      }
      roundMask = local_70;
      break;
    case '\x02':
      if (zSign == '\0') {
        local_68 = roundBits;
      }
      else {
        local_68 = 0;
      }
      roundMask = local_68;
      break;
    case '\x03':
      roundMask = 0;
      break;
    default:
      abort();
    }
    uVar2 = zSig1_local & roundBits;
    if (0x7ffc < zExp - 1U) {
      if ((0x7ffe < zExp) || ((zExp == 0x7ffe && (zSig1_local + roundMask < zSig1_local))))
      goto LAB_006a9683;
      if (zExp < 1) {
        if (status->flush_to_zero == '\0') {
          bVar3 = true;
          if ((status->float_detect_tininess != '\x01') && (bVar3 = true, -1 < zExp)) {
            bVar3 = zSig1_local <= zSig1_local + roundMask;
          }
          shift64RightJamming(zSig1_local,1 - zExp,&zSig1_local);
          zSig0_local._0_4_ = 0;
          uVar2 = zSig1_local & roundBits;
          if ((bVar3) && (uVar2 != 0)) {
            float_raise_aarch64('\x10',status);
          }
          if (uVar2 != 0) {
            status->float_exception_flags = status->float_exception_flags | 0x20;
          }
          if ((long)(roundMask + zSig1_local) < 0) {
            zSig0_local._0_4_ = 1;
          }
          if ((bVar4) && (uVar2 * 2 - (roundBits + 1U) == 0)) {
            roundBits = roundBits + 1U | roundBits;
          }
          zSig1_local = (roundBits ^ 0xffffffffffffffffU) & roundMask + zSig1_local;
          fVar5 = packFloatx80(zSig0_local._6_1_,(int32_t)zSig0_local,zSig1_local);
          local_10 = fVar5.high;
        }
        else {
          float_raise_aarch64(0x80,status);
          fVar5 = packFloatx80(zSig0_local._6_1_,0,0);
          local_10 = fVar5.high;
        }
        goto LAB_006a994a;
      }
    }
    if (uVar2 != 0) {
      status->float_exception_flags = status->float_exception_flags | 0x20;
    }
    zSig1_local = roundMask + zSig1_local;
    if (zSig1_local < (ulong)roundMask) {
      zSig0_local._0_4_ = zExp + 1;
      zSig1_local = 0x8000000000000000;
    }
    if ((bVar4) && (uVar2 * 2 - (roundBits + 1U) == 0)) {
      roundBits = roundBits + 1U | roundBits;
    }
    zSig1_local = (roundBits ^ 0xffffffffffffffffU) & zSig1_local;
    if (zSig1_local == 0) {
      zSig0_local._0_4_ = 0;
    }
    fVar5 = packFloatx80(zSign,(int32_t)zSig0_local,zSig1_local);
    local_10 = fVar5.high;
  }
LAB_006a994a:
  _zExp_local = fVar5.low;
  fVar5.high = local_10;
  fVar5.low = _zExp_local;
  return fVar5;
}

Assistant:

floatx80 roundAndPackFloatx80(int8_t roundingPrecision, flag zSign,
                              int32_t zExp, uint64_t zSig0, uint64_t zSig1,
                              float_status *status)
{
    int8_t roundingMode;
    flag roundNearestEven, increment, isTiny;
    int64_t roundIncrement, roundMask, roundBits;

    roundingMode = status->float_rounding_mode;
    roundNearestEven = ( roundingMode == float_round_nearest_even );
    if ( roundingPrecision == 80 ) goto precision80;
    if ( roundingPrecision == 64 ) {
        roundIncrement = UINT64_C(0x0000000000000400);
        roundMask = UINT64_C(0x00000000000007FF);
    }
    else if ( roundingPrecision == 32 ) {
        roundIncrement = UINT64_C(0x0000008000000000);
        roundMask = UINT64_C(0x000000FFFFFFFFFF);
    }
    else {
        goto precision80;
    }
    zSig0 |= ( zSig1 != 0 );
    switch (roundingMode) {
    case float_round_nearest_even:
    case float_round_ties_away:
        break;
    case float_round_to_zero:
        roundIncrement = 0;
        break;
    case float_round_up:
        roundIncrement = zSign ? 0 : roundMask;
        break;
    case float_round_down:
        roundIncrement = zSign ? roundMask : 0;
        break;
    default:
        abort();
    }
    roundBits = zSig0 & roundMask;
    if ( 0x7FFD <= (uint32_t) ( zExp - 1 ) ) {
        if (    ( 0x7FFE < zExp )
             || ( ( zExp == 0x7FFE ) && ( zSig0 + roundIncrement < zSig0 ) )
           ) {
            goto overflow;
        }
        if ( zExp <= 0 ) {
            if (status->flush_to_zero) {
                float_raise(float_flag_output_denormal, status);
                return packFloatx80(zSign, 0, 0);
            }
            isTiny =
                   (status->float_detect_tininess
                    == float_tininess_before_rounding)
                || ( zExp < 0 )
                || ( zSig0 <= zSig0 + roundIncrement );
            shift64RightJamming( zSig0, 1 - zExp, &zSig0 );
            zExp = 0;
            roundBits = zSig0 & roundMask;
            if (isTiny && roundBits) {
                float_raise(float_flag_underflow, status);
            }
            if (roundBits) {
                status->float_exception_flags |= float_flag_inexact;
            }
            zSig0 += roundIncrement;
            if ( (int64_t) zSig0 < 0 ) zExp = 1;
            roundIncrement = roundMask + 1;
            if ( roundNearestEven && ( roundBits<<1 == roundIncrement ) ) {
                roundMask |= roundIncrement;
            }
            zSig0 &= ~ roundMask;
            return packFloatx80( zSign, zExp, zSig0 );
        }
    }
    if (roundBits) {
        status->float_exception_flags |= float_flag_inexact;
    }
    zSig0 += roundIncrement;
    if ( zSig0 < roundIncrement ) {
        ++zExp;
        zSig0 = UINT64_C(0x8000000000000000);
    }
    roundIncrement = roundMask + 1;
    if ( roundNearestEven && ( roundBits<<1 == roundIncrement ) ) {
        roundMask |= roundIncrement;
    }
    zSig0 &= ~ roundMask;
    if ( zSig0 == 0 ) zExp = 0;
    return packFloatx80( zSign, zExp, zSig0 );
 precision80:
    switch (roundingMode) {
    case float_round_nearest_even:
    case float_round_ties_away:
        increment = ((int64_t)zSig1 < 0);
        break;
    case float_round_to_zero:
        increment = 0;
        break;
    case float_round_up:
        increment = !zSign && zSig1;
        break;
    case float_round_down:
        increment = zSign && zSig1;
        break;
    default:
        abort();
    }
    if ( 0x7FFD <= (uint32_t) ( zExp - 1 ) ) {
        if (    ( 0x7FFE < zExp )
             || (    ( zExp == 0x7FFE )
                  && ( zSig0 == UINT64_C(0xFFFFFFFFFFFFFFFF) )
                  && increment
                )
           ) {
            roundMask = 0;
 overflow:
            float_raise(float_flag_overflow | float_flag_inexact, status);
            if (    ( roundingMode == float_round_to_zero )
                 || ( zSign && ( roundingMode == float_round_up ) )
                 || ( ! zSign && ( roundingMode == float_round_down ) )
               ) {
                return packFloatx80( zSign, 0x7FFE, ~ roundMask );
            }
            return packFloatx80(zSign,
                                floatx80_infinity_high,
                                floatx80_infinity_low);
        }
        if ( zExp <= 0 ) {
            isTiny =
                   (status->float_detect_tininess
                    == float_tininess_before_rounding)
                || ( zExp < 0 )
                || ! increment
                || ( zSig0 < UINT64_C(0xFFFFFFFFFFFFFFFF) );
            shift64ExtraRightJamming( zSig0, zSig1, 1 - zExp, &zSig0, &zSig1 );
            zExp = 0;
            if (isTiny && zSig1) {
                float_raise(float_flag_underflow, status);
            }
            if (zSig1) {
                status->float_exception_flags |= float_flag_inexact;
            }
            switch (roundingMode) {
            case float_round_nearest_even:
            case float_round_ties_away:
                increment = ((int64_t)zSig1 < 0);
                break;
            case float_round_to_zero:
                increment = 0;
                break;
            case float_round_up:
                increment = !zSign && zSig1;
                break;
            case float_round_down:
                increment = zSign && zSig1;
                break;
            default:
                abort();
            }
            if ( increment ) {
                ++zSig0;
                zSig0 &=
                    ~ ( ( (uint64_t) ( zSig1<<1 ) == 0 ) & roundNearestEven );
                if ( (int64_t) zSig0 < 0 ) zExp = 1;
            }
            return packFloatx80( zSign, zExp, zSig0 );
        }
    }
    if (zSig1) {
        status->float_exception_flags |= float_flag_inexact;
    }
    if ( increment ) {
        ++zSig0;
        if ( zSig0 == 0 ) {
            ++zExp;
            zSig0 = UINT64_C(0x8000000000000000);
        }
        else {
            zSig0 &= ~ ( ( (uint64_t) ( zSig1<<1 ) == 0 ) & roundNearestEven );
        }
    }
    else {
        if ( zSig0 == 0 ) zExp = 0;
    }
    return packFloatx80( zSign, zExp, zSig0 );

}